

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

uint64_t compute_chunk_unpack_size
                   (int x,int y,int width,int height,int lpc,exr_const_priv_part_t part)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  long in_R9;
  uint64_t chansz;
  exr_attr_chlist_entry_t *curc;
  int c;
  exr_attr_chlist_t *chanlist;
  uint64_t unpacksize;
  int local_34;
  uint64_t local_28;
  
  local_28 = 0;
  if ((*(short *)(in_R9 + 0xf2) == 0) && (in_ECX == in_R8D)) {
    local_28 = *(uint64_t *)(in_R9 + 0xe8);
  }
  else {
    piVar1 = *(int **)(*(long *)(in_R9 + 0x20) + 0x18);
    for (local_34 = 0; local_34 < *piVar1; local_34 = local_34 + 1) {
      lVar5 = *(long *)(piVar1 + 2) + (long)local_34 * 0x20;
      iVar2 = 4;
      if (*(int *)(lVar5 + 0x10) == 1) {
        iVar2 = 2;
      }
      iVar3 = compute_sampled_width(in_EDX,*(int *)(lVar5 + 0x18),in_EDI);
      iVar4 = compute_sampled_height(in_ECX,*(int *)(lVar5 + 0x1c),in_ESI);
      local_28 = (long)iVar4 * (long)iVar3 * (long)iVar2 + local_28;
    }
  }
  return local_28;
}

Assistant:

static uint64_t
compute_chunk_unpack_size (
    int x, int y, int width, int height, int lpc, exr_const_priv_part_t part)
{
    uint64_t unpacksize = 0;
    if (part->chan_has_line_sampling || height != lpc)
    {
        const exr_attr_chlist_t* chanlist = part->channels->chlist;
        for (int c = 0; c < chanlist->num_channels; ++c)
        {
            const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
            uint64_t chansz = ((curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4);

            chansz *=
                (uint64_t) compute_sampled_width (width, curc->x_sampling, x);
            chansz *=
                (uint64_t) compute_sampled_height (height, curc->y_sampling, y);

            unpacksize += chansz;
        }
    }
    else
        unpacksize = part->unpacked_size_per_chunk;
    return unpacksize;
}